

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_update_cache_time(event_base *base)

{
  event_base *local_18;
  event_base *base_local;
  
  local_18 = base;
  if ((base == (event_base *)0x0) &&
     (local_18 = event_global_current_base_, event_global_current_base_ == (event_base *)0x0)) {
    base_local._4_4_ = -1;
  }
  else {
    if (local_18->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,local_18->th_base_lock);
    }
    if (local_18->running_loop != 0) {
      update_time_cache(local_18);
    }
    if (local_18->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,local_18->th_base_lock);
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_update_cache_time(struct event_base *base)
{

	if (!base) {
		base = current_base;
		if (!current_base)
			return -1;
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->running_loop)
		update_time_cache(base);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return 0;
}